

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

bool File::isAbsolutePath(String *path)

{
  char *pcVar1;
  usize uVar2;
  bool local_1b;
  bool local_1a;
  bool local_19;
  char *data;
  String *path_local;
  
  pcVar1 = String::operator_cast_to_char_(path);
  local_19 = true;
  if ((*pcVar1 != '/') && (local_19 = true, *pcVar1 != '\\')) {
    uVar2 = String::length(path);
    local_1a = false;
    if ((2 < uVar2) && (local_1a = false, pcVar1[1] == ':')) {
      local_1b = true;
      if (pcVar1[2] != '/') {
        local_1b = pcVar1[2] == '\\';
      }
      local_1a = local_1b;
    }
    local_19 = local_1a;
  }
  return local_19;
}

Assistant:

bool File::isAbsolutePath(const String& path)
{
  const char* data = path;
  return *data == '/' || *data == '\\' || (path.length() > 2 && data[1] == ':' && (data[2] == '/' || data[2] == '\\'));
}